

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitLoop
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,Loop *curr)

{
  Name breakTo;
  bool bVar1;
  int local_9c;
  undefined1 local_70 [8];
  Flow flow;
  Index loopCount;
  Loop *curr_local;
  ExpressionRunner<wasm::CExpressionRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str._4_4_ = 0;
  do {
    visit((Flow *)local_70,this,curr->body);
    bVar1 = Flow::breaking((Flow *)local_70);
    if ((bVar1) &&
       (bVar1 = IString::operator==((IString *)
                                    ((long)&flow.values.super_SmallVector<wasm::Literal,_1UL>.
                                            flexible.
                                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                            ._M_impl.super__Vector_impl_data + 0x10),
                                    &(curr->name).super_IString), bVar1)) {
      if ((this->maxLoopIterations == 0) ||
         (flow.breakTo.super_IString.str._M_str._4_4_ =
               flow.breakTo.super_IString.str._M_str._4_4_ + 1,
         flow.breakTo.super_IString.str._M_str._4_4_ < this->maxLoopIterations)) {
        local_9c = 2;
      }
      else {
        breakTo.super_IString.str._M_str = DAT_03194068;
        breakTo.super_IString.str._M_len = NONCONSTANT_FLOW;
        Flow::Flow(__return_storage_ptr__,breakTo);
        local_9c = 1;
      }
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_70);
      local_9c = 1;
    }
    Flow::~Flow((Flow *)local_70);
  } while (local_9c != 1);
  return __return_storage_ptr__;
}

Assistant:

Flow visitLoop(Loop* curr) {
    NOTE_ENTER("Loop");
    Index loopCount = 0;
    while (1) {
      Flow flow = visit(curr->body);
      if (flow.breaking()) {
        if (flow.breakTo == curr->name) {
          if (maxLoopIterations != NO_LIMIT &&
              ++loopCount >= maxLoopIterations) {
            return Flow(NONCONSTANT_FLOW);
          }
          continue; // lol
        }
      }
      // loop does not loop automatically, only continue achieves that
      return flow;
    }
  }